

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsocks5socketengine.cpp
# Opt level: O2

void __thiscall
QSocks5BindStore::add(QSocks5BindStore *this,qintptr socketDescriptor,QSocks5BindData *bindData)

{
  long in_FS_OFFSET;
  QSocks5BindData *local_50;
  qintptr local_48;
  undefined1 local_40 [16];
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_40._0_8_ = &this->mutex;
  local_40._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_50 = bindData;
  local_48 = socketDescriptor;
  QRecursiveMutex::lock((QRecursiveMutex *)local_40._0_8_);
  local_40[8] = true;
  QHash<long_long,_QSocks5BindData_*>::contains(&this->store,&local_48);
  QElapsedTimer::start();
  QHash<long_long,QSocks5BindData*>::emplace<QSocks5BindData*const&>
            ((QHash<long_long,QSocks5BindData*> *)&this->store,&local_48,&local_50);
  if ((this->sweepTimer).m_id == Invalid) {
    QBasicTimer::start(&this->sweepTimer,(Duration)0xdf8475800,&this->super_QObject);
  }
  QMutexLocker<QRecursiveMutex>::~QMutexLocker((QMutexLocker<QRecursiveMutex> *)local_40);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QSocks5BindStore::add(qintptr socketDescriptor, QSocks5BindData *bindData)
{
    QMutexLocker lock(&mutex);
    if (store.contains(socketDescriptor)) {
        // qDebug("delete it");
    }
    bindData->timeStamp.start();
    store.insert(socketDescriptor, bindData);

    // start sweep timer if not started
    if (!sweepTimer.isActive())
        sweepTimer.start(1min, this);
}